

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

Pattern * __thiscall
trieste::detail::Pattern::operator++(Pattern *__return_storage_ptr__,Pattern *this,int param_1)

{
  bool bVar1;
  element_type *peVar2;
  FastPattern local_140;
  shared_ptr<trieste::detail::PatternDef> local_d8;
  shared_ptr<trieste::detail::PatternDef> local_c8;
  undefined4 local_b8;
  FastPattern local_a8;
  shared_ptr<trieste::detail::PatternDef> local_40;
  undefined1 local_30 [8];
  PatternPtr result;
  int param_1_local;
  Pattern *this_local;
  
  result.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = param_1;
  peVar2 = std::
           __shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  (*peVar2->_vptr_PatternDef[2])(local_30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    std::shared_ptr<trieste::detail::PatternDef>::shared_ptr
              (&local_40,(shared_ptr<trieste::detail::PatternDef> *)local_30);
    FastPattern::match_any();
    Pattern(__return_storage_ptr__,&local_40,&local_a8);
    FastPattern::~FastPattern(&local_a8);
    std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr(&local_40);
  }
  else {
    std::make_shared<trieste::detail::Rep,std::shared_ptr<trieste::detail::PatternDef>const&>
              (&local_d8);
    std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::Rep,void>
              (&local_c8,(shared_ptr<trieste::detail::Rep> *)&local_d8);
    FastPattern::match_opt(&local_140,&this->fast_pattern);
    Pattern(__return_storage_ptr__,&local_c8,&local_140);
    FastPattern::~FastPattern(&local_140);
    std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr(&local_c8);
    std::shared_ptr<trieste::detail::Rep>::~shared_ptr
              ((shared_ptr<trieste::detail::Rep> *)&local_d8);
  }
  local_b8 = 1;
  std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr
            ((shared_ptr<trieste::detail::PatternDef> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Pattern operator++(int) const
      {
        auto result = pattern->custom_rep();
        if (result)
          // With a custom rep many things can happen.  We overapproximate here.
          // We could do better, but it's not worth the effort.
          return {result, FastPattern::match_any()};

        return {
          std::make_shared<Rep>(pattern), FastPattern::match_opt(fast_pattern)};
      }